

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_78;
  string *local_58;
  string *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  Command::Command(&this->super_Command);
  (this->super_Command).super_Group.super_Base._vptr_Base =
       (_func_int **)&PTR__ArgumentParser_001221c8;
  local_50 = (string *)&this->longprefix;
  local_38 = &(this->longprefix).field_2;
  (this->longprefix)._M_dataplus._M_p = (pointer)local_38;
  (this->longprefix)._M_string_length = 0;
  (this->longprefix).field_2._M_local_buf[0] = '\0';
  local_58 = (string *)&this->shortprefix;
  local_40 = &(this->shortprefix).field_2;
  (this->shortprefix)._M_dataplus._M_p = (pointer)local_40;
  (this->shortprefix)._M_string_length = 0;
  (this->shortprefix).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->longseparator).field_2;
  (this->longseparator)._M_dataplus._M_p = (pointer)local_48;
  (this->longseparator)._M_string_length = 0;
  (this->longseparator).field_2._M_local_buf[0] = '\0';
  (this->terminator)._M_dataplus._M_p = (pointer)&(this->terminator).field_2;
  (this->terminator)._M_string_length = 0;
  (this->terminator).field_2._M_local_buf[0] = '\0';
  this->allowJoinedShortValue = true;
  this->allowJoinedLongValue = true;
  this->allowSeparateShortValue = true;
  this->allowSeparateLongValue = true;
  this->completion = (CompletionFlag *)0x0;
  this->readCompletion = false;
  HelpParams::HelpParams(&this->helpParams);
  std::__cxx11::string::_M_assign((string *)&(this->super_Command).description);
  std::__cxx11::string::_M_assign((string *)&(this->super_Command).epilog);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--","");
  std::__cxx11::string::_M_assign(local_50);
  std::__cxx11::string::_M_assign((string *)&(this->helpParams).longPrefix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-","");
  std::__cxx11::string::_M_assign(local_58);
  std::__cxx11::string::_M_assign((string *)&(this->helpParams).shortPrefix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"=","");
  LongSeparator(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--","");
  std::__cxx11::string::_M_assign((string *)&this->terminator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  SetArgumentSeparations(this,true,true,true,true);
  (this->super_Command).super_Group.super_Base.matched = true;
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string())
            {
                Description(description_);
                Epilog(epilog_);
                LongPrefix("--");
                ShortPrefix("-");
                LongSeparator("=");
                Terminator("--");
                SetArgumentSeparations(true, true, true, true);
                matched = true;
            }